

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

uint32 crnd::crnd_crn_format_to_fourcc(crn_format fmt)

{
  crn_format fmt_local;
  
  switch(fmt) {
  case cCRNFmtDXT1:
    fmt_local._4_4_ = 0x31545844;
    break;
  case cCRNFmtDXT3:
    fmt_local._4_4_ = 0x33545844;
    break;
  case cCRNFmtDXT5:
    fmt_local._4_4_ = 0x35545844;
    break;
  case cCRNFmtDXT5_CCxY:
    fmt_local._4_4_ = 0x59784343;
    break;
  case cCRNFmtDXT5_xGxR:
    fmt_local._4_4_ = 0x52784778;
    break;
  case cCRNFmtDXT5_xGBR:
    fmt_local._4_4_ = 0x52424778;
    break;
  case cCRNFmtDXT5_AGBR:
    fmt_local._4_4_ = 0x52424741;
    break;
  case cCRNFmtDXN_XY:
    fmt_local._4_4_ = 0x59583241;
    break;
  case cCRNFmtDXN_YX:
    fmt_local._4_4_ = 0x32495441;
    break;
  case cCRNFmtDXT5A:
    fmt_local._4_4_ = 0x31495441;
    break;
  case cCRNFmtETC1:
    fmt_local._4_4_ = 0x31435445;
    break;
  case cCRNFmtETC2:
    fmt_local._4_4_ = 0x32435445;
    break;
  case cCRNFmtETC2A:
    fmt_local._4_4_ = 0x41325445;
    break;
  case cCRNFmtETC1S:
    fmt_local._4_4_ = 0x53315445;
    break;
  case cCRNFmtETC2AS:
    fmt_local._4_4_ = 0x53413245;
    break;
  default:
    fmt_local._4_4_ = cCRNFmtDXT1 >> 0x20;
  }
  return fmt_local._4_4_;
}

Assistant:

uint32 crnd_crn_format_to_fourcc(crn_format fmt)
    {
        switch (fmt)
        {
            case cCRNFmtDXT1:
                return CRND_FOURCC('D', 'X', 'T', '1');
            case cCRNFmtDXT3:
                return CRND_FOURCC('D', 'X', 'T', '3');
            case cCRNFmtDXT5:
                return CRND_FOURCC('D', 'X', 'T', '5');
            case cCRNFmtDXN_XY:
                return CRND_FOURCC('A', '2', 'X', 'Y');
            case cCRNFmtDXN_YX:
                return CRND_FOURCC('A', 'T', 'I', '2');
            case cCRNFmtDXT5A:
                return CRND_FOURCC('A', 'T', 'I', '1');
            case cCRNFmtDXT5_CCxY:
                return CRND_FOURCC('C', 'C', 'x', 'Y');
            case cCRNFmtDXT5_xGxR:
                return CRND_FOURCC('x', 'G', 'x', 'R');
            case cCRNFmtDXT5_xGBR:
                return CRND_FOURCC('x', 'G', 'B', 'R');
            case cCRNFmtDXT5_AGBR:
                return CRND_FOURCC('A', 'G', 'B', 'R');
            case cCRNFmtETC1:
                return CRND_FOURCC('E', 'T', 'C', '1');
            case cCRNFmtETC2:
                return CRND_FOURCC('E', 'T', 'C', '2');
            case cCRNFmtETC2A:
                return CRND_FOURCC('E', 'T', '2', 'A');
            case cCRNFmtETC1S:
                return CRND_FOURCC('E', 'T', '1', 'S');
            case cCRNFmtETC2AS:
                return CRND_FOURCC('E', '2', 'A', 'S');
            default:
                break;
        }
        CRND_ASSERT(false);
        return 0;
    }